

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O3

tuple<unsigned_long,_unsigned_long> __thiscall Controller::getBoardAttributes(Controller *this)

{
  BoardSize boardSize_00;
  BoardMode BVar1;
  uint uVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  _Head_base<0UL,_unsigned_long,_false> extraout_RDX;
  undefined8 *in_RSI;
  tuple<unsigned_long,_unsigned_long> tVar5;
  BoardSize boardSize;
  BoardSize local_1c;
  
  boardSize_00 = Board::getSize((Board *)*in_RSI);
  local_1c = boardSize_00;
  BVar1 = Board::getMode((Board *)*in_RSI);
  if (BVar1 == NUMERIC) {
    uVar2 = Options::getTileSize();
    sVar3 = (size_t)uVar2;
  }
  else {
    sVar3 = ImageProvider::getTileSize((ImageProvider *)in_RSI[1],boardSize_00);
  }
  pmVar4 = std::
           map<BoardSize,_unsigned_long,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_unsigned_long>_>_>
           ::at(&Maps::boardSizeInt,&local_1c);
  (this->board)._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>._M_t.
  super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.super__Head_base<0UL,_Board_*,_false>
  ._M_head_impl = (Board *)(sVar3 & 0xffffffff);
  (this->imageProvider)._M_t.
  super___uniq_ptr_impl<ImageProvider,_std::default_delete<ImageProvider>_>._M_t.
  super__Tuple_impl<0UL,_ImageProvider_*,_std::default_delete<ImageProvider>_>.
  super__Head_base<0UL,_ImageProvider_*,_false>._M_head_impl = (ImageProvider *)*pmVar4;
  tVar5.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = extraout_RDX._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<1UL,_unsigned_long>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<1UL,_unsigned_long,_false>)(_Head_base<1UL,_unsigned_long,_false>)this;
  return (tuple<unsigned_long,_unsigned_long>)
         tVar5.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long>;
}

Assistant:

std::tuple<size_t, size_t> Controller::getBoardAttributes()
{
    BoardSize boardSize = board->getSize();
    uint tileSize = board->getMode() == BoardMode::NUMERIC ?
                        Options::getTileSize() : imageProvider->getTileSize( boardSize );
    return { Maps::boardSizeInt.at( boardSize ), tileSize };
}